

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O0

int doride(void)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  monst *local_18;
  schar local_10;
  char local_f;
  char local_e;
  boolean local_d;
  int local_c;
  schar dz;
  schar dy;
  schar dx;
  boolean forcemount;
  
  local_d = '\0';
  if (u.usteed == (monst *)0x0) {
    iVar3 = getdir((char *)0x0,&local_e,&local_f,&local_10);
    if ((((iVar3 == 0) || ((int)u.ux + (int)local_e < 1)) || (0x4f < (int)u.ux + (int)local_e)) ||
       (((int)u.uy + (int)local_f < 0 || (0x14 < (int)u.uy + (int)local_f)))) {
      local_c = 0;
    }
    else {
      if (flags.debug != '\0') {
        cVar1 = yn_function("Force the mount to succeed?","yn",'n');
        if (cVar1 == 'y') {
          local_d = '\x01';
        }
      }
      if ((level->monsters[(int)u.ux + (int)local_e][(int)u.uy + (int)local_f] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[(int)u.ux + (int)local_e][(int)u.uy + (int)local_f]->field_0x60
           >> 9 & 1) != 0)) {
        local_18 = (monst *)0x0;
      }
      else {
        local_18 = level->monsters[(int)u.ux + (int)local_e][(int)u.uy + (int)local_f];
      }
      bVar2 = mount_steed(local_18,local_d);
      local_c = (int)bVar2;
    }
  }
  else {
    dismount_steed(6);
    local_c = 1;
  }
  return local_c;
}

Assistant:

int doride(void)
{
	boolean forcemount = FALSE;
	schar dx, dy, dz;

	if (u.usteed)
	    dismount_steed(DISMOUNT_BYCHOICE);
	else if (getdir(NULL, &dx, &dy, &dz) &&
	         isok(u.ux+dx, u.uy+dy)) {
	    if (wizard && yn("Force the mount to succeed?") == 'y')
		forcemount = TRUE;
	    return mount_steed(m_at(level, u.ux+dx, u.uy+dy), forcemount);
	} else
	    return 0;
	return 1;
}